

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_listener_accept(void *arg,nng_aio *aio)

{
  _Bool _Var1;
  sfd_listener *l;
  nng_aio *aio_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xb0));
  _Var1 = nni_aio_start(aio,sfd_cancel_accept,arg);
  if (_Var1) {
    if ((*(byte *)((long)arg + 0x94) & 1) == 0) {
      if (*(int *)((long)arg + 0x50) == 0) {
        nni_aio_list_append((nni_list *)((long)arg + 0x98),aio);
      }
      else {
        sfd_start_conn((sfd_listener *)arg,aio);
      }
      nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
      nni_aio_finish_error(aio,NNG_ECLOSED);
    }
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
  }
  return;
}

Assistant:

static void
sfd_listener_accept(void *arg, nng_aio *aio)
{
	sfd_listener *l = arg;

	nni_mtx_lock(&l->mtx);
	if (!nni_aio_start(aio, sfd_cancel_accept, l)) {
		nni_mtx_unlock(&l->mtx);
		return;
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}

	if (l->listen_cnt) {
		sfd_start_conn(l, aio);
	} else {
		nni_aio_list_append(&l->accept_q, aio);
	}
	nni_mtx_unlock(&l->mtx);
}